

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

int __thiscall
leveldb::MemTable::KeyComparator::operator()(KeyComparator *this,char *aptr,char *bptr)

{
  int iVar1;
  Slice b;
  Slice a;
  Slice local_38;
  Slice local_28;
  
  local_28 = GetLengthPrefixedSlice(aptr);
  local_38 = GetLengthPrefixedSlice(bptr);
  iVar1 = InternalKeyComparator::Compare(&this->comparator,&local_28,&local_38);
  return iVar1;
}

Assistant:

int MemTable::KeyComparator::operator()(const char* aptr,
                                        const char* bptr) const {
  // Internal keys are encoded as length-prefixed strings.
  Slice a = GetLengthPrefixedSlice(aptr);
  Slice b = GetLengthPrefixedSlice(bptr);
  return comparator.Compare(a, b);
}